

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen.h
# Opt level: O1

Enum * __thiscall
flatbuffers::BaseBfbsGenerator::GetEnumByIndex(BaseBfbsGenerator *this,int32_t index)

{
  Schema *pSVar1;
  long lVar2;
  ushort uVar3;
  
  pSVar1 = this->schema_;
  if (-1 < index && pSVar1 != (Schema *)0x0) {
    lVar2 = -(long)*(int *)pSVar1;
    if (*(ushort *)(pSVar1 + -(long)*(int *)pSVar1) < 7) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(pSVar1 + lVar2 + 6);
    }
    if (index < *(int *)(pSVar1 + (ulong)*(uint *)(pSVar1 + uVar3) + (ulong)uVar3)) {
      if (*(ushort *)(pSVar1 + -(long)*(int *)pSVar1) < 7) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ushort *)(pSVar1 + lVar2 + 6);
      }
      if (uVar3 == 0) {
        pSVar1 = (Schema *)0x0;
      }
      else {
        pSVar1 = pSVar1 + (ulong)*(uint *)(pSVar1 + uVar3) + (ulong)uVar3;
      }
      if ((uint)index < *(uint *)pSVar1) {
        return (Enum *)(pSVar1 + (ulong)*(uint *)(pSVar1 + (ulong)(uint)(index << 2) + 4) +
                                 (ulong)(uint)(index << 2) + 4);
      }
      __assert_fail("i < size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                    ,0xc1,
                    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Enum>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Enum>, SizeT = unsigned int]"
                   );
    }
  }
  return (Enum *)0x0;
}

Assistant:

const reflection::Enum *GetEnumByIndex(int32_t index) const {
    if (!schema_ || index < 0 ||
        index >= static_cast<int32_t>(schema_->enums()->size())) {
      return nullptr;
    }
    return schema_->enums()->Get(index);
  }